

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetCMakePropertyCommand.cxx
# Opt level: O2

bool __thiscall
cmGetCMakePropertyCommand::InitialPass
          (cmGetCMakePropertyCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  char *pcVar4;
  cmGlobalGenerator *pcVar5;
  cmState *this_00;
  ulong uVar6;
  string output;
  string variable;
  allocator local_79;
  string local_78;
  char *local_58;
  undefined8 local_50;
  string local_38;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar6 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  if (uVar6 < 0x21) {
    std::__cxx11::string::string
              ((string *)&local_38,"called with incorrect number of arguments",
               (allocator *)&local_58);
    cmCommand::SetError(&this->super_cmCommand,&local_38);
  }
  else {
    std::__cxx11::string::string((string *)&local_38,(string *)pbVar1);
    std::__cxx11::string::string((string *)&local_58,"NOTFOUND",(allocator *)&local_78);
    bVar3 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1,"VARIABLES");
    if (bVar3) {
      pcVar2 = (this->super_cmCommand).Makefile;
      std::__cxx11::string::string((string *)&local_78,"VARIABLES",&local_79);
      pcVar4 = cmMakefile::GetProperty(pcVar2,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      if (pcVar4 != (char *)0x0) {
        std::__cxx11::string::assign((char *)&local_58);
      }
    }
    else {
      bVar3 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 1,"MACROS");
      if (bVar3) {
        local_50 = 0;
        *local_58 = '\0';
        pcVar2 = (this->super_cmCommand).Makefile;
        std::__cxx11::string::string((string *)&local_78,"MACROS",&local_79);
        pcVar4 = cmMakefile::GetProperty(pcVar2,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        if (pcVar4 != (char *)0x0) {
          std::__cxx11::string::assign((char *)&local_58);
        }
      }
      else {
        bVar3 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 1,"COMPONENTS");
        if (bVar3) {
          pcVar5 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
          cmJoin<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                    (&local_78,&pcVar5->InstallComponents,";");
          std::__cxx11::string::operator=((string *)&local_58,(string *)&local_78);
          std::__cxx11::string::~string((string *)&local_78);
        }
        else if ((args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start[1]._M_string_length != 0) {
          this_00 = cmMakefile::GetState((this->super_cmCommand).Makefile);
          pcVar4 = cmState::GetGlobalProperty
                             (this_00,(args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + 1);
          if (pcVar4 != (char *)0x0) {
            std::__cxx11::string::assign((char *)&local_58);
          }
        }
      }
    }
    cmMakefile::AddDefinition((this->super_cmCommand).Makefile,&local_38,local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  std::__cxx11::string::~string((string *)&local_38);
  return 0x20 < uVar6;
}

Assistant:

bool cmGetCMakePropertyCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 2 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  std::string variable = args[0];
  std::string output = "NOTFOUND";

  if ( args[1] == "VARIABLES" )
    {
    if (const char* varsProp = this->Makefile->GetProperty("VARIABLES"))
      {
      output = varsProp;
      }
    }
  else if ( args[1] == "MACROS" )
    {
    output.clear();
    if (const char* macrosProp = this->Makefile->GetProperty("MACROS"))
      {
      output = macrosProp;
      }
    }
  else if ( args[1] == "COMPONENTS" )
    {
    const std::set<std::string>* components
      = this->Makefile->GetGlobalGenerator()->GetInstallComponents();
    output = cmJoin(*components, ";");
    }
  else
    {
    const char *prop = 0;
    if (!args[1].empty())
      {
      prop = this->Makefile->GetState()->GetGlobalProperty(args[1]);
      }
    if (prop)
      {
      output = prop;
      }
    }

  this->Makefile->AddDefinition(variable, output.c_str());

  return true;
}